

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiColumnTotalSize(Fts5Context *pCtx,int iCol,sqlite3_int64 *pnToken)

{
  uint uVar1;
  Fts5Storage *p;
  i64 *piVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  p = *(Fts5Storage **)(*(long *)pCtx + 0x28);
  iVar3 = fts5StorageLoadTotals(p,0);
  if (iVar3 == 0) {
    *pnToken = 0;
    uVar1 = p->pConfig->nCol;
    if (iCol < 0) {
      if (0 < (int)uVar1) {
        piVar2 = p->aTotalSize;
        uVar4 = 0;
        lVar5 = 0;
        do {
          lVar5 = lVar5 + piVar2[uVar4];
          *pnToken = lVar5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
        return 0;
      }
    }
    else {
      if ((int)uVar1 <= iCol) {
        return 0x19;
      }
      *pnToken = p->aTotalSize[(uint)iCol];
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int fts5ApiColumnTotalSize(
  Fts5Context *pCtx, 
  int iCol, 
  sqlite3_int64 *pnToken
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageSize(pTab->pStorage, iCol, pnToken);
}